

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

string_view __thiscall inja::Lexer::clear_final_line_if_whitespace(Lexer *this,string_view text)

{
  char cVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  Lexer *pLVar4;
  Lexer *pLVar5;
  string_view sVar6;
  
  pcVar3 = (char *)text._M_len;
  pLVar5 = this;
  do {
    pLVar4 = pLVar5;
    pLVar5 = (Lexer *)((long)&pLVar4[-1].pos + 7);
    if (pLVar4 == (Lexer *)0x0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pcVar3;
      return (string_view)(auVar2 << 0x40);
    }
    cVar1 = (pcVar3 + -1)[(long)pLVar4];
  } while ((cVar1 == '\t') || (cVar1 == ' '));
  if ((cVar1 == '\n') || (cVar1 == '\r')) {
    this = pLVar4;
  }
  sVar6._M_str = pcVar3;
  sVar6._M_len = (size_t)this;
  return sVar6;
}

Assistant:

static std::string_view clear_final_line_if_whitespace(std::string_view text) {
    std::string_view result = text;
    while (!result.empty()) {
      const char ch = result.back();
      if (ch == ' ' || ch == '\t') {
        result.remove_suffix(1);
      } else if (ch == '\n' || ch == '\r') {
        break;
      } else {
        return text;
      }
    }
    return result;
  }